

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msc.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
msc::
mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
          (double param_1,vector<double,_std::allocator<double>_> *__return_storage_ptr__,msc *this,
          long *point,long *first,uint param_6)

{
  pointer pdVar1;
  pointer pdVar2;
  invalid_argument *this_00;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  it;
  double dVar7;
  double d;
  double dVar8;
  double dVar9;
  allocator_type local_31;
  double local_30;
  
  local_30 = param_1;
  if ((int)param_6 < 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Dimension must be greater than 0");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(ulong)param_6,&local_31);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pdVar2 - (long)pdVar1 >> 3;
  if (point == first) {
    dVar7 = 0.0;
  }
  else {
    dVar7 = 0.0;
    do {
      lVar4 = *point;
      uVar5 = 0;
      dVar8 = 0.0;
      do {
        dVar9 = *(double *)(lVar4 + uVar5 * 8) - *(double *)(this + uVar5 * 8);
        dVar8 = dVar8 + dVar9 * dVar9;
        uVar5 = uVar5 + 1;
      } while (param_6 != uVar5);
      dVar8 = (double)(-(ulong)(dVar8 * local_30 <= 1.0) & (ulong)(1.0 - dVar8 * local_30));
      if (pdVar2 != pdVar1) {
        lVar6 = 0;
        do {
          pdVar1[lVar6] = *(double *)(lVar4 + lVar6 * 8) * dVar8 + pdVar1[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar3 + (ulong)(lVar3 == 0) != lVar6);
      }
      dVar7 = dVar7 + dVar8;
      point = point + 3;
    } while (point != first);
  }
  if (pdVar2 != pdVar1) {
    lVar4 = 0;
    do {
      pdVar1[lVar4] = pdVar1[lVar4] / dVar7;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> mean_shift(const T* point,
    ForwardIterator first, ForwardIterator last, int dim,
    Metric metric, Kernel kernel, Estimator estimator)
{
    if (dim <= 0)
        throw std::invalid_argument("Dimension must be greater than 0");
    typedef typename std::iterator_traits<ForwardIterator>::value_type C;

    std::vector<T> shifted(dim);
    const auto ibw = estimator(point, first, last, dim, metric);
    double total_weight = 0;

    for (auto it = first; it != last; it++)
    {
        const T* pt = Accessor<T, C>::data(*it);
        const auto dist = metric(pt, point, dim);
        const auto weight = kernel(dist * ibw);
        for (std::size_t k = 0; k < shifted.size(); k++)
            shifted[k] += pt[k] * weight;
        total_weight += weight;
    }

    for (std::size_t k = 0; k < shifted.size(); k++)
        shifted[k] /= total_weight;

    return shifted;
}